

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBody.cpp
# Opt level: O2

void __thiscall
chrono::ChBody::SetCollisionModel
          (ChBody *this,shared_ptr<chrono::collision::ChCollisionModel> *new_collision_model)

{
  ChSystem *pCVar1;
  element_type *peVar2;
  __shared_ptr<chrono::collision::ChCollisionSystem,_(__gnu_cxx::_Lock_policy)2> local_30;
  
  if (((this->collision_model).
       super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
       (element_type *)0x0) &&
     (pCVar1 = (this->super_ChPhysicsItem).system, pCVar1 != (ChSystem *)0x0)) {
    std::__shared_ptr<chrono::collision::ChCollisionSystem,_(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr(&local_30,
                 &(pCVar1->collision_system).
                  super___shared_ptr<chrono::collision::ChCollisionSystem,_(__gnu_cxx::_Lock_policy)2>
                );
    (*(local_30._M_ptr)->_vptr_ChCollisionSystem[5])
              (local_30._M_ptr,
               (this->collision_model).
               super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30._M_refcount);
  }
  std::__shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->collision_model).
              super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>,
             &new_collision_model->
              super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>);
  peVar2 = (this->collision_model).
           super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  (*peVar2->_vptr_ChCollisionModel[0x16])(peVar2,&this->super_ChContactable_1vars<6>);
  return;
}

Assistant:

void ChBody::SetCollisionModel(std::shared_ptr<collision::ChCollisionModel> new_collision_model) {
    if (collision_model) {
        if (system)
            system->GetCollisionSystem()->Remove(collision_model.get());
    }

    collision_model = new_collision_model;
    collision_model->SetContactable(this);
}